

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvKrylovDemo_prec.c
# Opt level: O1

void WebRates(sunrealtype x,sunrealtype y,sunrealtype t,sunrealtype *c,sunrealtype *rate,
             WebData wdata)

{
  int iVar1;
  sunrealtype (*pasVar2) [6];
  long lVar3;
  long lVar4;
  sunrealtype *psVar5;
  long lVar6;
  
  iVar1 = wdata->ns;
  lVar6 = (long)iVar1;
  if (0 < lVar6) {
    memset(rate,0,lVar6 * 8);
  }
  if (0 < iVar1) {
    pasVar2 = wdata->acoef;
    lVar3 = 0;
    do {
      lVar4 = 0;
      psVar5 = rate;
      do {
        *psVar5 = c[lVar3] * (*pasVar2)[lVar4] + *psVar5;
        psVar5 = psVar5 + 1;
        lVar4 = lVar4 + 6;
      } while (lVar6 * 6 != lVar4);
      lVar3 = lVar3 + 1;
      pasVar2 = (sunrealtype (*) [6])(*pasVar2 + 1);
    } while (lVar3 != lVar6);
  }
  if (0 < iVar1) {
    lVar3 = 0;
    do {
      rate[lVar3] = (wdata->bcoef[lVar3] * (x * y + 1.0) + rate[lVar3]) * c[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar6 != lVar3);
  }
  return;
}

Assistant:

static void WebRates(sunrealtype x, sunrealtype y, sunrealtype t,
                     sunrealtype c[], sunrealtype rate[], WebData wdata)
{
  int i, j, ns;
  sunrealtype fac, *bcoef;
  sunrealtype(*acoef)[NS];

  ns    = wdata->ns;
  acoef = wdata->acoef;
  bcoef = wdata->bcoef;

  for (i = 0; i < ns; i++) { rate[i] = ZERO; }

  for (j = 0; j < ns; j++)
  {
    for (i = 0; i < ns; i++) { rate[i] += c[j] * acoef[i][j]; }
  }

  fac = ONE + ALPHA * x * y;
  for (i = 0; i < ns; i++) { rate[i] = c[i] * (bcoef[i] * fac + rate[i]); }
}